

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expFuncFileExists(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  anon_union_8_2_b358304e_for_ExpressionValue_1 aVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  StringLiteral *fileName;
  path fullName;
  filesystem *local_58;
  path local_50;
  path local_30;
  
  bVar1 = getExpFuncParameter(parameters,0,(StringLiteral **)&local_58,funcName,false);
  if (bVar1) {
    ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>(&local_30,local_58,source);
    getFullPathName(&local_50,&local_30);
    ghc::filesystem::path::~path(&local_30);
    aVar2._0_1_ = ghc::filesystem::exists(&local_50);
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    aVar2.intValue._1_7_ = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Integer;
    __return_storage_ptr__->field_1 = aVar2;
    ghc::filesystem::path::~path(&local_50);
  }
  else {
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFileExists(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	GET_PARAM(parameters,0,fileName);

	auto fullName = getFullPathName(fileName->path());
	return ExpressionValue(fs::exists(fullName) ? INT64_C(1) : INT64_C(0));
}